

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp
# Opt level: O1

IterateResult __thiscall
glcts::MultisampleTextureTexStorage2DZeroSampleTest::iterate
          (MultisampleTextureTexStorage2DZeroSampleTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  TestError *this_00;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  initInternals(this);
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x1390))(0x9100,0,0x8058,1,1,1);
  iVar1 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  if (iVar1 == 0x501) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    return STOP;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Invalid error code reported",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
             ,0x56b);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult MultisampleTextureTexStorage2DZeroSampleTest::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	initInternals();

	/* Issue call function for target GL_TEXTURE_2D_MULTISAMPLE, but provide zero for samples argument */
	gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, 0, GL_RGBA8, 1, 1, true);

	/* Check if the expected error code was reported */
	glw::GLenum error_code = gl.getError();

	if (error_code != GL_INVALID_VALUE)
	{
		TCU_FAIL("Invalid error code reported");
	}

	/* Test case passed */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}